

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O1

void __thiscall
vkt::QueryPool::anon_unknown_0::StateObjects::setVertices
          (StateObjects *this,DeviceInterface *vk,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertices)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Allocation *pAVar3;
  void *pvVar4;
  pointer pVVar5;
  Buffer *pBVar6;
  undefined8 uVar7;
  VkDevice device;
  long lVar8;
  long lVar9;
  Allocation local_70;
  Allocation local_50;
  
  device = Context::getDevice(this->m_context);
  pAVar3 = (((this->m_vertexBuffer).m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_70._vptr_Allocation = (_func_int **)&PTR__Allocation_00d7f278;
  pvVar4 = pAVar3->m_hostPtr;
  local_70.m_memory.m_internal = (pAVar3->m_memory).m_internal;
  local_70.m_offset = pAVar3->m_offset;
  local_70.m_hostPtr = pvVar4;
  ::vk::Allocation::~Allocation(&local_70);
  pVVar5 = (vertices->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(vertices->
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 4;
  if (0 < lVar8) {
    lVar8 = lVar8 + 1;
    lVar9 = 0;
    do {
      puVar1 = (undefined8 *)((long)pVVar5->m_data + lVar9);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)((long)pvVar4 + lVar9);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      lVar8 = lVar8 + -1;
      lVar9 = lVar9 + 0x10;
    } while (1 < lVar8);
  }
  pBVar6 = (this->m_vertexBuffer).m_ptr;
  pAVar3 = (pBVar6->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_70._vptr_Allocation = (_func_int **)&PTR__Allocation_00d7f278;
  local_70.m_memory.m_internal = (pAVar3->m_memory).m_internal;
  local_70.m_offset = pAVar3->m_offset;
  local_70.m_hostPtr = pAVar3->m_hostPtr;
  pAVar3 = (pBVar6->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_50._vptr_Allocation = (_func_int **)&PTR__Allocation_00d7f278;
  local_50.m_memory.m_internal = (pAVar3->m_memory).m_internal;
  local_50.m_offset = pAVar3->m_offset;
  local_50.m_hostPtr = pAVar3->m_hostPtr;
  ::vk::flushMappedMemoryRange
            (vk,device,local_70.m_memory,local_50.m_offset,
             (long)(vertices->
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(vertices->
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
  ::vk::Allocation::~Allocation(&local_50);
  ::vk::Allocation::~Allocation(&local_70);
  return;
}

Assistant:

void StateObjects::setVertices (const vk::DeviceInterface&vk, std::vector<tcu::Vec4> vertices)
{
	const vk::VkDevice device			= m_context.getDevice();

	tcu::Vec4 *ptr = reinterpret_cast<tcu::Vec4*>(m_vertexBuffer->getBoundMemory().getHostPtr());
	std::copy(vertices.begin(), vertices.end(), ptr);

	vk::flushMappedMemoryRange(vk, device,	m_vertexBuffer->getBoundMemory().getMemory(), m_vertexBuffer->getBoundMemory().getOffset(),	vertices.size() * sizeof(vertices[0]));
}